

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_link(void)

{
  uv_fs_cb p_Var1;
  int iVar2;
  int iVar3;
  uv_loop_t *loop;
  undefined8 uVar4;
  uv_buf_t uVar5;
  uv_file link;
  uv_file file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  ::loop = (uv_loop_t *)uv_default_loop();
  req.bufsml[3].len._4_4_ = uv_fs_open(0,&link,"test_file",0x42,0x180);
  p_Var1 = req.cb;
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x791,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x792,"req.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&link);
  iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
  req.bufsml[3].len._4_4_ =
       uv_fs_write(0,&link,(ulong)p_Var1 & 0xffffffff,&iov,1,0xffffffffffffffff,0);
  if (req.bufsml[3].len._4_4_ != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x798,"r == sizeof(test_buf)");
    abort();
  }
  if (req.cb != (uv_fs_cb)0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x799,"req.result == sizeof(test_buf)");
    abort();
  }
  uv_fs_req_cleanup(&link);
  uv_fs_close(::loop,&link,(ulong)p_Var1 & 0xffffffff,0);
  req.bufsml[3].len._4_4_ = uv_fs_link(0,&link,"test_file","test_file_link");
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7a0,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7a1,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&link);
  req.bufsml[3].len._4_4_ = uv_fs_open(0,&link,"test_file_link",2,0);
  p_Var1 = req.cb;
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7a5,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7a6,"req.result >= 0");
    abort();
  }
  iVar3 = (int)req.cb;
  uv_fs_req_cleanup(&link);
  memset(buf,0,0x20);
  uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
  iov = uVar5;
  req.bufsml[3].len._4_4_ = uv_fs_read(0,&link,(ulong)p_Var1 & 0xffffffff,&iov,1,0,0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7ad,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7ae,"req.result >= 0");
    abort();
  }
  iVar2 = strcmp(buf,test_buf);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7af,"strcmp(buf, test_buf) == 0");
    abort();
  }
  close(iVar3);
  req.bufsml[3].len._4_4_ = uv_fs_link(::loop,&link,"test_file","test_file_link2",link_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7b5,"r == 0");
    abort();
  }
  uv_run(::loop,0);
  if (link_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7b7,"link_cb_count == 1");
    abort();
  }
  req.bufsml[3].len._4_4_ = uv_fs_open(0,&link,"test_file_link2",2,0);
  p_Var1 = req.cb;
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7ba,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7bb,"req.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&link);
  memset(buf,0,0x20);
  uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
  iov = uVar5;
  req.bufsml[3].len._4_4_ = uv_fs_read(0,&link,(ulong)p_Var1 & 0xffffffff,&iov,1,0,0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7c2,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7c3,"req.result >= 0");
    abort();
  }
  iVar3 = strcmp(buf,test_buf);
  if (iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7c4,"strcmp(buf, test_buf) == 0");
    abort();
  }
  uv_fs_close(::loop,&link,(ulong)p_Var1 & 0xffffffff,0);
  uv_run(::loop,0);
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar4 = uv_default_loop();
  iVar3 = uv_loop_close(uVar4);
  if (iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x7d3,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_file link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  uv_fs_close(loop, &req, file, NULL);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  close(link);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(link_cb_count == 1);

  r = uv_fs_open(NULL, &req, "test_file_link2", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  link = req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);

  uv_fs_close(loop, &req, link, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}